

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O2

bool __thiscall duckdb::ListColumnData::IsPersistent(ListColumnData *this)

{
  bool bVar1;
  int iVar2;
  pointer pCVar3;
  
  bVar1 = ColumnData::IsPersistent(&this->super_ColumnData);
  if (bVar1) {
    bVar1 = ColumnData::IsPersistent(&(this->validity).super_ColumnData);
    if (bVar1) {
      pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
               operator->(&this->child_column);
      iVar2 = (*pCVar3->_vptr_ColumnData[0x1e])(pCVar3);
      return SUB41(iVar2,0);
    }
  }
  return false;
}

Assistant:

bool ListColumnData::IsPersistent() {
	return ColumnData::IsPersistent() && validity.IsPersistent() && child_column->IsPersistent();
}